

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::parse_msgpack_internal
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
           *this)

{
  bool bVar1;
  char_int_type cVar2;
  long in_RDI;
  double dVar3;
  string last_token;
  uint32_t len_3;
  uint16_t len_2;
  uint32_t len_1;
  uint16_t len;
  int64_t number_9;
  int32_t number_8;
  int16_t number_7;
  int8_t number_6;
  uint64_t number_5;
  uint32_t number_4;
  uint16_t number_3;
  uint8_t number_2;
  double number_1;
  float number;
  binary_t b;
  string_t s;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffdb8;
  double *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  input_format_t format;
  long *plVar4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffdd8;
  undefined8 uVar5;
  undefined4 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde5;
  undefined1 in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  undefined1 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffde9;
  undefined1 in_stack_fffffffffffffdea;
  undefined1 in_stack_fffffffffffffdeb;
  undefined1 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffdf8;
  byte local_1f2;
  byte local_1d3;
  byte local_1d1;
  byte local_1c1;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  input_format_t in_stack_fffffffffffffe74;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffe78;
  string local_178 [32];
  string local_158 [8];
  string_t *in_stack_fffffffffffffeb0;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec8;
  input_format_t in_stack_fffffffffffffed4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffed8;
  string local_110 [8];
  string *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  allocator<char> local_b9;
  string local_b8 [32];
  undefined8 local_98;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  string local_88 [36];
  float local_64;
  undefined1 local_60 [48];
  string local_30 [47];
  byte local_1;
  
  format = (input_format_t)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  cVar2 = get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
               *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  switch(cVar2) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))
                        (*(long **)(in_RDI + 0x28),(long)*(int *)(in_RDI + 0x10));
    local_1 = local_1 & 1;
    break;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
    local_1 = get_msgpack_object(in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0);
    break;
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
    local_1 = get_msgpack_array(in_stack_fffffffffffffdb8,
                                CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    break;
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xd9:
  case 0xda:
  case 0xdb:
    std::__cxx11::string::string(local_30);
    bVar1 = get_msgpack_string(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    local_1c1 = 0;
    if (bVar1) {
      local_1c1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                            (*(long **)(in_RDI + 0x28),local_30);
    }
    local_1 = local_1c1 & 1;
    std::__cxx11::string::~string(local_30);
    break;
  case 0xc0:
    local_1 = (**(code **)**(undefined8 **)(in_RDI + 0x28))();
    local_1 = local_1 & 1;
    break;
  default:
    get_token_string(in_stack_fffffffffffffdf8);
    uVar5 = *(undefined8 *)(in_RDI + 0x18);
    plVar4 = *(long **)(in_RDI + 0x28);
    std::operator+((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT15(in_stack_fffffffffffffded,
                                                  CONCAT14(in_stack_fffffffffffffdec,
                                                           CONCAT13(in_stack_fffffffffffffdeb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdea,
                                                  CONCAT11(in_stack_fffffffffffffde9,
                                                           in_stack_fffffffffffffde8))))))),
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffde7,
                        CONCAT16(in_stack_fffffffffffffde6,
                                 CONCAT15(in_stack_fffffffffffffde5,
                                          CONCAT14(in_stack_fffffffffffffde4,
                                                   in_stack_fffffffffffffde0)))));
    exception_message(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe60);
    parse_error::create(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffef8);
    local_1 = (**(code **)(*plVar4 + 0x60))(plVar4,uVar5,local_110,&stack0xfffffffffffffec8);
    local_1 = local_1 & 1;
    parse_error::~parse_error((parse_error *)0x113394);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_110);
    break;
  case 0xc2:
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),0);
    local_1 = local_1 & 1;
    break;
  case 0xc3:
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),1);
    local_1 = local_1 & 1;
    break;
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    bVar1 = get_msgpack_binary(in_stack_fffffffffffffdf8,(binary_t *)in_stack_fffffffffffffdf0);
    local_1d1 = 0;
    if (bVar1) {
      local_1d1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))
                            (*(long **)(in_RDI + 0x28),local_60);
    }
    local_1 = local_1d1 & 1;
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x112a93);
    break;
  case 0xca:
    local_64 = 0.0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<float,false>
                      (in_stack_fffffffffffffdd8,format,(float *)in_stack_fffffffffffffdc8);
    local_8a = 0;
    local_8b = 0;
    local_1d3 = 0;
    if (bVar1) {
      plVar4 = *(long **)(in_RDI + 0x28);
      dVar3 = (double)local_64;
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,
                 (char *)CONCAT17(in_stack_fffffffffffffdef,
                                  CONCAT16(in_stack_fffffffffffffdee,
                                           CONCAT15(in_stack_fffffffffffffded,
                                                    CONCAT14(in_stack_fffffffffffffdec,
                                                             CONCAT13(in_stack_fffffffffffffdeb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffdea,
                                                  CONCAT11(in_stack_fffffffffffffde9,
                                                           in_stack_fffffffffffffde8))))))),
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffde7,
                          CONCAT16(in_stack_fffffffffffffde6,
                                   CONCAT15(in_stack_fffffffffffffde5,
                                            CONCAT14(in_stack_fffffffffffffde4,
                                                     in_stack_fffffffffffffde0)))));
      local_8b = 1;
      local_1d3 = (**(code **)(*plVar4 + 0x20))(dVar3,plVar4,local_88);
    }
    local_1 = local_1d3 & 1;
    if ((local_8b & 1) != 0) {
      std::__cxx11::string::~string(local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    break;
  case 0xcb:
    local_98 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<double,false>(in_stack_fffffffffffffdd8,format,in_stack_fffffffffffffdc8);
    local_1f2 = 0;
    if (bVar1) {
      this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (in_RDI + 0x28);
      uVar5 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   CONCAT15(in_stack_fffffffffffffded,
                                                            CONCAT14(in_stack_fffffffffffffdec,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffdeb,
                                                  CONCAT12(in_stack_fffffffffffffdea,
                                                           CONCAT11(in_stack_fffffffffffffde9,
                                                                    in_stack_fffffffffffffde8)))))))
                 ,(allocator<char> *)
                  CONCAT17(in_stack_fffffffffffffde7,
                           CONCAT16(in_stack_fffffffffffffde6,
                                    CONCAT15(in_stack_fffffffffffffde5,
                                             CONCAT14(in_stack_fffffffffffffde4,
                                                      in_stack_fffffffffffffde0)))));
      local_1f2 = (**(code **)(*(long *)this_00 + 0x20))(uVar5,this_00,local_b8);
    }
    local_1 = local_1f2 & 1;
    if (bVar1) {
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    break;
  case 0xcc:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_char,false>
                      (in_stack_fffffffffffffdd8,format,(uchar *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xcd:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_short,false>
                      (in_stack_fffffffffffffdd8,format,(unsigned_short *)in_stack_fffffffffffffdc8)
    ;
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xce:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_int,false>
                      (in_stack_fffffffffffffdd8,format,(uint *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xcf:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_long,false>
                      (in_stack_fffffffffffffdd8,format,(unsigned_long *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xd0:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<signed_char,false>
                      (in_stack_fffffffffffffdd8,format,(char *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xd1:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<short,false>
                      (in_stack_fffffffffffffdd8,format,(short *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xd2:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<int,false>
                      (in_stack_fffffffffffffdd8,format,(int *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xd3:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<long,false>
                      (in_stack_fffffffffffffdd8,format,(long *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = local_1 & 1;
    break;
  case 0xdc:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_short,false>
                      (in_stack_fffffffffffffdd8,format,(unsigned_short *)in_stack_fffffffffffffdc8)
    ;
    local_1 = 0;
    if (bVar1) {
      local_1 = get_msgpack_array(in_stack_fffffffffffffdb8,
                                  CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    }
    break;
  case 0xdd:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_int,false>
                      (in_stack_fffffffffffffdd8,format,(uint *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = get_msgpack_array(in_stack_fffffffffffffdb8,
                                  CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    }
    break;
  case 0xde:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_short,false>
                      (in_stack_fffffffffffffdd8,format,(unsigned_short *)in_stack_fffffffffffffdc8)
    ;
    local_1 = 0;
    if (bVar1) {
      local_1 = get_msgpack_object(in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0);
    }
    break;
  case 0xdf:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_int,false>
                      (in_stack_fffffffffffffdd8,format,(uint *)in_stack_fffffffffffffdc8);
    local_1 = 0;
    if (bVar1) {
      local_1 = get_msgpack_object(in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0);
    }
    break;
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                        (*(long **)(in_RDI + 0x28),(long)(char)*(undefined4 *)(in_RDI + 0x10));
    local_1 = local_1 & 1;
    break;
  case -1:
    local_1 = unexpect_eof(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                           in_stack_fffffffffffffec8);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_msgpack_internal()
    {
        switch (get())
        {
            // EOF
            case std::char_traits<char_type>::eof():
                return unexpect_eof(input_format_t::msgpack, "value");

            // positive fixint
            case 0x00:
            case 0x01:
            case 0x02:
            case 0x03:
            case 0x04:
            case 0x05:
            case 0x06:
            case 0x07:
            case 0x08:
            case 0x09:
            case 0x0A:
            case 0x0B:
            case 0x0C:
            case 0x0D:
            case 0x0E:
            case 0x0F:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x14:
            case 0x15:
            case 0x16:
            case 0x17:
            case 0x18:
            case 0x19:
            case 0x1A:
            case 0x1B:
            case 0x1C:
            case 0x1D:
            case 0x1E:
            case 0x1F:
            case 0x20:
            case 0x21:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x28:
            case 0x29:
            case 0x2A:
            case 0x2B:
            case 0x2C:
            case 0x2D:
            case 0x2E:
            case 0x2F:
            case 0x30:
            case 0x31:
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
            case 0x36:
            case 0x37:
            case 0x38:
            case 0x39:
            case 0x3A:
            case 0x3B:
            case 0x3C:
            case 0x3D:
            case 0x3E:
            case 0x3F:
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4A:
            case 0x4B:
            case 0x4C:
            case 0x4D:
            case 0x4E:
            case 0x4F:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            case 0x58:
            case 0x59:
            case 0x5A:
            case 0x5B:
            case 0x5C:
            case 0x5D:
            case 0x5E:
            case 0x5F:
            case 0x60:
            case 0x61:
            case 0x62:
            case 0x63:
            case 0x64:
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x68:
            case 0x69:
            case 0x6A:
            case 0x6B:
            case 0x6C:
            case 0x6D:
            case 0x6E:
            case 0x6F:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x73:
            case 0x74:
            case 0x75:
            case 0x76:
            case 0x77:
            case 0x78:
            case 0x79:
            case 0x7A:
            case 0x7B:
            case 0x7C:
            case 0x7D:
            case 0x7E:
            case 0x7F:
                return sax->number_unsigned(static_cast<number_unsigned_t>(current));

            // fixmap
            case 0x80:
            case 0x81:
            case 0x82:
            case 0x83:
            case 0x84:
            case 0x85:
            case 0x86:
            case 0x87:
            case 0x88:
            case 0x89:
            case 0x8A:
            case 0x8B:
            case 0x8C:
            case 0x8D:
            case 0x8E:
            case 0x8F:
                return get_msgpack_object(static_cast<std::size_t>(static_cast<unsigned int>(current) & 0x0Fu));

            // fixarray
            case 0x90:
            case 0x91:
            case 0x92:
            case 0x93:
            case 0x94:
            case 0x95:
            case 0x96:
            case 0x97:
            case 0x98:
            case 0x99:
            case 0x9A:
            case 0x9B:
            case 0x9C:
            case 0x9D:
            case 0x9E:
            case 0x9F:
                return get_msgpack_array(static_cast<std::size_t>(static_cast<unsigned int>(current) & 0x0Fu));

            // fixstr
            case 0xA0:
            case 0xA1:
            case 0xA2:
            case 0xA3:
            case 0xA4:
            case 0xA5:
            case 0xA6:
            case 0xA7:
            case 0xA8:
            case 0xA9:
            case 0xAA:
            case 0xAB:
            case 0xAC:
            case 0xAD:
            case 0xAE:
            case 0xAF:
            case 0xB0:
            case 0xB1:
            case 0xB2:
            case 0xB3:
            case 0xB4:
            case 0xB5:
            case 0xB6:
            case 0xB7:
            case 0xB8:
            case 0xB9:
            case 0xBA:
            case 0xBB:
            case 0xBC:
            case 0xBD:
            case 0xBE:
            case 0xBF:
            case 0xD9: // str 8
            case 0xDA: // str 16
            case 0xDB: // str 32
            {
                string_t s;
                return get_msgpack_string(s) && sax->string(s);
            }

            case 0xC0: // nil
                return sax->null();

            case 0xC2: // false
                return sax->boolean(false);

            case 0xC3: // true
                return sax->boolean(true);

            case 0xC4: // bin 8
            case 0xC5: // bin 16
            case 0xC6: // bin 32
            case 0xC7: // ext 8
            case 0xC8: // ext 16
            case 0xC9: // ext 32
            case 0xD4: // fixext 1
            case 0xD5: // fixext 2
            case 0xD6: // fixext 4
            case 0xD7: // fixext 8
            case 0xD8: // fixext 16
            {
                binary_t b;
                return get_msgpack_binary(b) && sax->binary(b);
            }

            case 0xCA: // float 32
            {
                float number{};
                return get_number(input_format_t::msgpack, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0xCB: // float 64
            {
                double number{};
                return get_number(input_format_t::msgpack, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0xCC: // uint 8
            {
                std::uint8_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xCD: // uint 16
            {
                std::uint16_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xCE: // uint 32
            {
                std::uint32_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xCF: // uint 64
            {
                std::uint64_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xD0: // int 8
            {
                std::int8_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xD1: // int 16
            {
                std::int16_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xD2: // int 32
            {
                std::int32_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xD3: // int 64
            {
                std::int64_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xDC: // array 16
            {
                std::uint16_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_array(static_cast<std::size_t>(len));
            }

            case 0xDD: // array 32
            {
                std::uint32_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_array(static_cast<std::size_t>(len));
            }

            case 0xDE: // map 16
            {
                std::uint16_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_object(static_cast<std::size_t>(len));
            }

            case 0xDF: // map 32
            {
                std::uint32_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_object(static_cast<std::size_t>(len));
            }

            // negative fixint
            case 0xE0:
            case 0xE1:
            case 0xE2:
            case 0xE3:
            case 0xE4:
            case 0xE5:
            case 0xE6:
            case 0xE7:
            case 0xE8:
            case 0xE9:
            case 0xEA:
            case 0xEB:
            case 0xEC:
            case 0xED:
            case 0xEE:
            case 0xEF:
            case 0xF0:
            case 0xF1:
            case 0xF2:
            case 0xF3:
            case 0xF4:
            case 0xF5:
            case 0xF6:
            case 0xF7:
            case 0xF8:
            case 0xF9:
            case 0xFA:
            case 0xFB:
            case 0xFC:
            case 0xFD:
            case 0xFE:
            case 0xFF:
                return sax->number_integer(static_cast<std::int8_t>(current));

            default: // anything else
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::msgpack, "invalid byte: 0x" + last_token, "value")));
            }
        }
    }